

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O3

int linux_kevent_wait(kqueue *kq,int nevents,timespec *ts)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  pollfd local_30;
  
  iVar4 = -1;
  if (ts != (timespec *)0x0) {
    lVar3 = ts->tv_nsec * 0x790fb65668c26139;
    if ((lVar3 + 0x218def416bd80U >> 6 | lVar3 << 0x3a) < 0x10c6f7a0b5ed) {
      iVar4 = (int)(ts->tv_nsec / 1000000) + (int)ts->tv_sec * 1000;
    }
    else {
      local_30.fd = kq->epollfd;
      local_30.events = 1;
      iVar4 = 0;
      iVar1 = ppoll(&local_30,1,(timespec *)ts,(__sigset_t *)0x0);
      iVar2 = -1;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
      if (iVar1 < 1) {
        return iVar2;
      }
    }
  }
  iVar2 = kq->epollfd;
  lVar3 = __tls_get_addr(&PTR_0010bfd0);
  iVar2 = epoll_wait(iVar2,(epoll_event *)(lVar3 + 0x1930),nevents,iVar4);
  iVar4 = -1;
  if (-1 < iVar2) {
    iVar4 = iVar2;
  }
  return iVar4;
}

Assistant:

static int
linux_kevent_wait(struct kqueue *kq, int nevents, const struct timespec *ts)
{
    int timeout, nret;

    /* Use a high-resolution syscall if the timeout value's tv_nsec value has a resolution
     * finer than a millisecond. */
    if (ts != NULL && (ts->tv_nsec % 1000000 != 0)) {
        nret = linux_kevent_wait_hires(kq, ts);
        if (nret <= 0)
            return (nret);

        /* epoll_wait() should have ready events */
        timeout = 0;
    } else {
        /* Convert timeout to the format used by epoll_wait() */
        if (ts == NULL)
            timeout = -1;
        else
            timeout = (1000 * ts->tv_sec) + (ts->tv_nsec / 1000000);
    }

    dbg_puts("waiting for events");
    nret = epoll_wait(kqueue_epoll_fd(kq), epoll_events, nevents, timeout);
    if (nret < 0) {
        dbg_perror("epoll_wait");
        return (-1);
    }

    return (nret);
}